

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.h
# Opt level: O2

QVariant * __thiscall
QModelIndex::data(QVariant *__return_storage_ptr__,QModelIndex *this,int arole)

{
  QAbstractItemModel *pQVar1;
  
  pQVar1 = (this->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x90))(__return_storage_ptr__,pQVar1,this,arole);
  }
  return __return_storage_ptr__;
}

Assistant:

inline QVariant QModelIndex::data(int arole) const
{ return m ? m->data(*this, arole) : QVariant(); }